

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QUnifiedTimer::startAnimationDriver(QUnifiedTimer *this)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x88) == '\x01') {
    local_30.context.version = 2;
    local_30.context.function._4_4_ = 0;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.category = "default";
    QMessageLogger::warning
              (&local_30,"QUnifiedTimer::startAnimationDriver: driver is already running...");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  else {
    qVar1 = elapsed(this);
    *(qint64 *)(this + 0xc0) = qVar1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (**(code **)(**(long **)(this + 0x10) + 0x70))();
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::startAnimationDriver()
{
    if (driver->isRunning()) {
        qWarning("QUnifiedTimer::startAnimationDriver: driver is already running...");
        return;
    }
    // Set the start time to the currently elapsed() value before starting.
    // This means we get the animation system time including the temporal drift
    // which is what we want.
    driverStartTime = elapsed();
    driver->start();
}